

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O3

void __thiscall sznet::net::TcpConnection::stopReadInLoop(TcpConnection *this)

{
  EventLoop *this_00;
  Channel *this_01;
  bool bVar1;
  
  this_00 = this->m_loop;
  bVar1 = EventLoop::isInLoopThread(this_00);
  if (!bVar1) {
    EventLoop::abortNotInLoopThread(this_00);
  }
  this_01 = (this->m_channel)._M_t.
            super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
            _M_t.
            super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
            .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
  if ((this->m_reading != false) || ((this_01->m_events & 1) != 0)) {
    this_01->m_events = this_01->m_events & 0xfffffffe;
    Channel::update(this_01);
    this->m_reading = false;
  }
  return;
}

Assistant:

void TcpConnection::stopReadInLoop()
{
	m_loop->assertInLoopThread();
	if (m_reading || m_channel->isReading())
	{
		m_channel->disableReading();
		m_reading = false;
	}
}